

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qelfparser_p.cpp
# Opt level: O0

QString * anon_unknown.dwarf_1486d0f::ElfHeaderCheck<unsigned_long_long,_(QSysInfo::Endian)1>::
          explainCheckFailure(Ehdr *header)

{
  bool bVar1;
  Ehdr *in_RSI;
  QString *in_RDI;
  int in_stack_ffffffffffffffdc;
  QString *s;
  
  s = in_RDI;
  bVar1 = ElfHeaderCommonCheck::checkElfMagic(in_RSI->e_ident);
  if (bVar1) {
    bVar1 = checkClass(in_RSI->e_ident);
    if (bVar1) {
      bVar1 = checkDataOrder(in_RSI->e_ident);
      if (bVar1) {
        bVar1 = ElfHeaderCommonCheck::checkElfVersion(in_RSI->e_ident);
        if ((bVar1) && (bVar1 = checkFileVersion(in_RSI), bVar1)) {
          bVar1 = checkOsAbi(in_RSI->e_ident);
          if ((bVar1) && (bVar1 = checkAbiVersion(in_RSI->e_ident), bVar1)) {
            bVar1 = checkType(in_RSI);
            if (bVar1) {
              bVar1 = checkMachine(in_RSI);
              if (bVar1) {
                QString::QString((QString *)0x8ca7c7);
              }
              else {
                QLibrary::tr((char *)s,(char *)in_RDI,in_stack_ffffffffffffffdc);
              }
            }
            else {
              QLibrary::tr((char *)s,(char *)in_RDI,in_stack_ffffffffffffffdc);
            }
          }
          else {
            QLibrary::tr((char *)s,(char *)in_RDI,in_stack_ffffffffffffffdc);
          }
        }
        else {
          QLibrary::tr((char *)s,(char *)in_RDI,in_stack_ffffffffffffffdc);
        }
      }
      else {
        QLibrary::tr((char *)s,(char *)in_RDI,in_stack_ffffffffffffffdc);
      }
    }
    else {
      QLibrary::tr((char *)s,(char *)in_RDI,in_stack_ffffffffffffffdc);
    }
  }
  else {
    QLibrary::tr((char *)s,(char *)in_RDI,in_stack_ffffffffffffffdc);
  }
  return s;
}

Assistant:

Q_DECL_COLD_FUNCTION static QString explainCheckFailure(const Ehdr &header)
    {
        if (!checkElfMagic(header.e_ident))
            return QLibrary::tr("invalid signature");
        if (!checkClass(header.e_ident))
            return QLibrary::tr("file is for a different word size");
        if (!checkDataOrder(header.e_ident))
            return QLibrary::tr("file is for the wrong endianness");
        if (!checkElfVersion(header.e_ident) || !checkFileVersion(header))
            return QLibrary::tr("file has an unknown ELF version");
        if (!checkOsAbi(header.e_ident) || !checkAbiVersion(header.e_ident))
            return QLibrary::tr("file has an unexpected ABI");
        if (!checkType(header))
            return QLibrary::tr("file is not a shared object");
        if (!checkMachine(header))
            return QLibrary::tr("file is for a different processor");
        return QString();
    }